

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void action_papers(tgestate_t *state)

{
  byte bVar1;
  
  if ((0xfb < (byte)((state->hero_mappos).u + 0x93)) &&
     (0xfd < (byte)((state->hero_mappos).v + 0xb5))) {
    if (state->vischars[0].mi.sprite != sprites + 0x16) {
      solitary(state);
      return;
    }
    bVar1 = 0x66;
    if (state->morale < 0x66) {
      bVar1 = state->morale;
    }
    state->morale = bVar1 + 10;
    increase_score(state,'2');
    state->vischars[0].room = '\0';
    state->IY = state->vischars;
    transition(state,&action_papers::outside_main_gate);
    return;
  }
  return;
}

Assistant:

void action_papers(tgestate_t *state)
{
  /**
   * $EFF9: Position outside the main gate.
   */
  static const mappos8_t outside_main_gate = { 214, 138, 6 };

  uint16_t  range;  /* was DE */
  uint8_t  *pcoord; /* was HL */
  uint8_t   coord;  /* was A */

  assert(state != NULL);

  /* Is the hero within the main gate bounds? */
  // UNROLLED
  /* Range checking. X in (105..109) and Y in (73..75). */
  range = map_MAIN_GATE_X; // note the confused coords business
  pcoord = &state->hero_mappos.u;
  coord = *pcoord++;
  if (coord < ((range >> 8) & 0xFF) || coord >= ((range >> 0) & 0xFF))
    return;

  range = map_MAIN_GATE_Y;
  coord = *pcoord++; // -> state->hero_map_position.y
  if (coord < ((range >> 8) & 0xFF) || coord >= ((range >> 0) & 0xFF))
    return;

  /* Using the papers at the main gate when not in uniform causes the hero
   * to be sent to solitary */
  if (state->vischars[0].mi.sprite != &sprites[sprite_GUARD_FACING_AWAY_1])
  {
    solitary(state);
    return;
  }

  increase_morale_by_10_score_by_50(state);
  state->vischars[0].room = room_0_OUTDOORS;

  /* Transition to outside the main gate. */
  state->IY = &state->vischars[0];
  transition(state, &outside_main_gate);
  NEVER_RETURNS;
}